

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall
soul::StructuralParser::parseImports(StructuralParser *this,Namespace *parentNamespace)

{
  char *__s1;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  char (*in_R9) [18];
  string name;
  CompileMessage local_e8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2892ae);
  if (bVar2) {
    do {
      __s1 = (this->super_SOULTokeniser).currentType.text;
      if ((__s1 == "$string literal") ||
         ((__s1 != (char *)0x0 && (iVar3 = strcmp(__s1,"$string literal"), iVar3 == 0)))) {
        pcVar1 = (this->super_SOULTokeniser).currentStringValue._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,
                   pcVar1 + (this->super_SOULTokeniser).currentStringValue._M_string_length);
        AST::ImportsList::addIfNotAlreadyThere(&parentNamespace->importsList,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289cf2);
      }
      else if ((__s1 == "$identifier") ||
              ((__s1 != (char *)0x0 && (iVar3 = strcmp(__s1,"$identifier"), iVar3 == 0)))) {
        Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
        ::readIdentifier_abi_cxx11_
                  (&local_e8.description,
                   (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                    *)this);
        while (bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2838bd),
              bVar2) {
          Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::readIdentifier_abi_cxx11_
                    (&local_70,
                     (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2838bd);
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_a0 = *plVar5;
            lStack_98 = plVar4[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar5;
            local_b0 = (long *)*plVar4;
          }
          local_a8 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_e8.description._M_dataplus._M_p,
                   local_e8.description._M_dataplus._M_p + local_e8.description._M_string_length);
        AST::ImportsList::addIfNotAlreadyThere(&parentNamespace->importsList,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.description._M_dataplus._M_p != &local_e8.description.field_2)
        goto LAB_001f526c;
      }
      else {
        CompileMessageHelpers::createMessage<>
                  (&local_e8,syntax,error,"Expected a module identifier");
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_e8);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_e8.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.description._M_dataplus._M_p != &local_e8.description.field_2) {
LAB_001f526c:
          operator_delete(local_e8.description._M_dataplus._M_p,
                          local_e8.description.field_2._M_allocated_capacity + 1);
        }
      }
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2881d4);
      CompileMessageHelpers::createMessage<char_const(&)[18]>
                (&local_e8,(CompileMessageHelpers *)0x1,none,0x289852,"import statements",in_R9);
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_e8);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_e8.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.description._M_dataplus._M_p != &local_e8.description.field_2) {
        operator_delete(local_e8.description._M_dataplus._M_p,
                        local_e8.description.field_2._M_allocated_capacity + 1);
      }
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2892ae);
    } while (bVar2);
  }
  return;
}

Assistant:

void parseImports (AST::Namespace& parentNamespace)
    {
        while (matchIf (Keyword::import))
        {
            if (matches (Token::literalString))
            {
                parentNamespace.importsList.addIfNotAlreadyThere (currentStringValue);
                expect (Token::literalString);
            }
            else if (matches (Token::identifier))
            {
                auto name = readIdentifier();

                while (matchIf (Operator::dot))
                    name += "." + readIdentifier();

                parentNamespace.importsList.addIfNotAlreadyThere (name);
            }
            else
            {
                throwError (Errors::expectedModule());
            }

            expect (Operator::semicolon);
            throwError (Errors::notYetImplemented ("import statements"));
        }
    }